

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf2c.cpp
# Opt level: O3

void PrintUsage(string *filename)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,filename->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [inputfile]",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void PrintUsage(std::string const & filename) {
    std::cout << "Usage: " << filename << " [inputfile]" << std::endl;
}